

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  LZ4_stream_t *pLVar1;
  uint uVar2;
  LZ4_stream_t *pLVar3;
  int *piVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t *puVar7;
  long lVar8;
  char cVar9;
  ulong *puVar10;
  ulong *puVar11;
  char *pcVar12;
  long lVar13;
  ulong *puVar14;
  int iVar15;
  char *pcVar16;
  LZ4_stream_t *pLVar17;
  ulong uVar18;
  ulong *puVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint32_t *puVar24;
  LZ4_stream_t *pLVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  char cVar29;
  ulong *puVar30;
  ulong *puVar31;
  ulong *puVar32;
  uint uVar33;
  char *pcVar34;
  ulong uVar35;
  ulong *puVar36;
  ulong uVar37;
  BYTE *e;
  ulong *puVar38;
  long lVar39;
  int iVar40;
  int *piVar41;
  ulong uVar42;
  ulong uVar43;
  BYTE *s;
  int *piVar44;
  bool bVar45;
  U32 *hashTable;
  ulong *local_d0;
  int *local_c8;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  uVar23 = (LZ4_dict->internal_donotuse).dictSize;
  uVar26 = (ulong)uVar23;
  iVar40 = (int)dest;
  puVar11 = (ulong *)source;
  if (uVar26 < 0x10000) {
    uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
    if (uVar2 <= uVar23) goto LAB_001168ea;
    if (0x7e000000 < (uint)srcSize) goto LAB_001168f2;
    pLVar3 = (LZ4_stream_t *)(LZ4_dict->internal_donotuse).dictionary;
    (LZ4_dict->internal_donotuse).dictSize = uVar23 + srcSize;
    (LZ4_dict->internal_donotuse).currentOffset = uVar2 + srcSize;
    (LZ4_dict->internal_donotuse).tableType = 2;
    if (0xc < srcSize) {
      pcVar34 = source + -(ulong)uVar2;
      puVar10 = (ulong *)(source + (long)srcSize + -5);
      pcVar16 = (char *)((long)pLVar3 + (uVar26 - uVar2));
      *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar2;
      puVar32 = (ulong *)(source + 1);
      uVar42 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      puVar31 = (ulong *)(source + (long)srcSize + -0xc);
      iVar22 = 0;
      pLVar25 = (LZ4_stream_t *)source;
      pLVar17 = LZ4_dict;
      do {
        uVar21 = 0x40;
        uVar28 = 1;
        while( true ) {
          puVar30 = (ulong *)((ulong)uVar28 + (long)puVar32);
          iVar15 = (int)pcVar34;
          if (source + (long)srcSize + -0xb < puVar30) {
            iVar27 = 2;
          }
          else {
            uVar33 = (int)puVar32 - iVar15;
            uVar28 = *(uint *)((long)LZ4_dict + uVar42 * 4);
            pcVar12 = pcVar34;
            if (uVar28 < uVar2) {
              pcVar12 = pcVar16;
            }
            pLVar17 = (LZ4_stream_t *)(pcVar12 + uVar28);
            pLVar25 = (LZ4_stream_t *)source;
            if (uVar28 < uVar2) {
              pLVar25 = pLVar3;
            }
            uVar43 = *puVar30 * -0x30e4432345000000 >> 0x34;
            *(uint *)((long)LZ4_dict + uVar42 * 4) = uVar33;
            iVar27 = 8;
            uVar42 = uVar43;
            if ((uVar2 - uVar23 <= uVar28) && (uVar33 <= uVar28 + 0xffff)) {
              if ((pLVar17->internal_donotuse).hashTable[0] == (uint32_t)*puVar32) {
                iVar22 = uVar33 - uVar28;
                iVar27 = 7;
              }
              else {
                iVar27 = 0;
              }
            }
          }
          if ((iVar27 != 0) && (iVar27 != 8)) break;
          uVar28 = uVar21 >> 6;
          uVar21 = uVar21 + 1;
          puVar32 = puVar30;
        }
        if (iVar27 == 7) {
          iVar27 = 0;
        }
        if (iVar27 == 0) {
          iVar27 = (int)puVar32 - (int)puVar11;
          lVar13 = 0;
          uVar21 = iVar27 - 0xfU;
          cVar9 = (char)puVar32 * '\x10' + (char)puVar11 * -0x10;
          do {
            cVar29 = cVar9;
            uVar28 = uVar21;
            lVar20 = lVar13;
            pLVar1 = (LZ4_stream_t *)((long)pLVar17 + lVar20);
            puVar30 = (ulong *)((long)puVar32 + lVar20);
            if ((pLVar1 <= pLVar25) || (puVar30 <= puVar11)) break;
            lVar13 = lVar20 + -1;
            uVar21 = uVar28 - 1;
            cVar9 = cVar29 + -0x10;
          } while (*(char *)((long)puVar32 + lVar20 + -1) == *(char *)((long)pLVar17 + lVar20 + -1))
          ;
          iVar5 = (int)lVar20;
          puVar32 = (ulong *)((long)dest + 1);
          if ((uint)(iVar27 + iVar5) < 0xf) {
            *dest = cVar29;
          }
          else {
            uVar43 = (ulong)(iVar27 - 0xfU) + lVar20;
            *dest = -0x10;
            if (0xfe < (int)uVar43) {
              if (0x1fc < (int)uVar28) {
                uVar28 = 0x1fd;
              }
              uVar21 = (iVar27 - uVar28) + iVar5 + 0xef;
              uVar43 = (ulong)uVar21 / 0xff;
              memset(puVar32,0xff,(ulong)(uVar21 / 0xff + 1));
              puVar32 = (ulong *)((long)dest + uVar43 + 2);
              uVar43 = (ulong)(uint)(iVar27 + -0x10e + iVar5 + (int)uVar43 * -0xff);
            }
            *(char *)puVar32 = (char)uVar43;
            puVar32 = (ulong *)((long)puVar32 + 1);
          }
          puVar38 = (ulong *)((ulong)(uint)((int)puVar30 - (int)puVar11) + (long)puVar32);
          do {
            *puVar32 = *puVar11;
            puVar32 = puVar32 + 1;
            puVar11 = puVar11 + 1;
            puVar14 = (ulong *)dest;
            pLVar17 = pLVar1;
          } while (puVar32 < puVar38);
          do {
            *(short *)puVar38 = (short)iVar22;
            if (pLVar25 == pLVar3) {
              puVar11 = (ulong *)((char *)((long)pLVar3 + (uVar26 - (long)pLVar17)) + (long)puVar30)
              ;
              if (puVar10 < puVar11) {
                puVar11 = puVar10;
              }
              puVar32 = (ulong *)((long)puVar30 + 4);
              puVar24 = (pLVar17->internal_donotuse).hashTable + 1;
              puVar19 = puVar32;
              puVar7 = puVar24;
              if (puVar32 < (ulong *)((long)puVar11 - 7U)) {
                uVar18 = *(ulong *)((long)puVar30 + 4) ^
                         *(ulong *)((pLVar17->internal_donotuse).hashTable + 1);
                uVar43 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar43 = uVar43 >> 3 & 0x1fffffff;
                puVar19 = (ulong *)((long)puVar30 + 0xc);
                puVar7 = (pLVar17->internal_donotuse).hashTable + 3;
                if (*(ulong *)((pLVar17->internal_donotuse).hashTable + 1) ==
                    *(ulong *)((long)puVar30 + 4)) goto LAB_001164f0;
              }
              else {
LAB_001164f0:
                do {
                  puVar24 = puVar7;
                  if ((ulong *)((long)puVar11 - 7U) <= puVar19) {
                    if ((puVar19 < (ulong *)((long)puVar11 - 3U)) &&
                       (*puVar24 == (uint32_t)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar24 = puVar24 + 1;
                    }
                    if ((puVar19 < (ulong *)((long)puVar11 - 1U)) &&
                       ((short)*puVar24 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar24 = (uint32_t *)((long)puVar24 + 2);
                    }
                    if (puVar19 < puVar11) {
                      uVar6 = *puVar24;
                      puVar24 = (uint32_t *)CONCAT71((int7)((ulong)puVar24 >> 8),(char)uVar6);
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((char)uVar6 == (char)*puVar19));
                    }
                    uVar43 = (ulong)(uint)((int)puVar19 - (int)puVar32);
                    goto LAB_00116530;
                  }
                  uVar43 = *(ulong *)puVar24;
                  uVar18 = *puVar19;
                  uVar35 = uVar18 ^ uVar43;
                  uVar37 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  iVar27 = (int)puVar19;
                  puVar24 = puVar24 + 2;
                  puVar19 = puVar19 + 1;
                  puVar7 = puVar24;
                } while (uVar43 == uVar18);
                uVar43 = (ulong)((((uint)(uVar37 >> 3) & 0x1fffffff) + iVar27) - (int)puVar32);
              }
LAB_00116530:
              puVar30 = (ulong *)((long)puVar30 + uVar43 + 4);
              if (puVar30 == puVar11) {
                puVar19 = puVar11;
                puVar32 = (ulong *)source;
                if (puVar11 < puVar31) {
                  uVar18 = *(ulong *)source;
                  uVar37 = *puVar11;
                  uVar35 = 0;
                  if ((uVar37 ^ uVar18) != 0) {
                    for (; ((uVar37 ^ uVar18) >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  puVar24 = (uint32_t *)(uVar35 >> 3 & 0x1fffffff);
                  uVar21 = (uint)puVar24;
                  if (uVar18 == uVar37) {
                    puVar32 = (ulong *)(source + (ulong)(uVar18 == uVar37) * 8);
                    puVar19 = puVar11 + (uVar18 == uVar37);
                    goto LAB_0011657b;
                  }
                }
                else {
LAB_0011657b:
                  do {
                    if (puVar31 <= puVar19) {
                      if ((puVar19 < source + (long)srcSize + -8) &&
                         ((int)*puVar32 == (int)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 4);
                        puVar32 = (ulong *)((long)puVar32 + 4);
                      }
                      if ((puVar19 < source + (long)srcSize + -6) &&
                         ((short)*puVar32 == (short)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 2);
                        puVar32 = (ulong *)((long)puVar32 + 2);
                      }
                      if (puVar19 < puVar10) {
                        puVar19 = (ulong *)((long)puVar19 +
                                           (ulong)((char)*puVar32 == (char)*puVar19));
                      }
                      uVar21 = (int)puVar19 - (int)puVar11;
                      break;
                    }
                    uVar18 = *puVar32;
                    uVar35 = *puVar19 ^ uVar18;
                    uVar37 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    puVar36 = (ulong *)((uVar37 >> 3 & 0x1fffffff) + (long)puVar19);
                    puVar32 = puVar32 + 1;
                    bVar45 = uVar18 == *puVar19;
                    puVar19 = puVar19 + 1;
                    if (!bVar45) {
                      puVar19 = puVar36;
                    }
                    puVar24 = (uint32_t *)((ulong)puVar24 & 0xffffffff);
                    if (!bVar45) {
                      puVar24 = (uint32_t *)(ulong)(uint)((int)puVar36 - (int)puVar11);
                    }
                    uVar21 = (uint)puVar24;
                  } while (bVar45);
                }
                uVar43 = (ulong)((int)uVar43 + uVar21);
                puVar30 = (ulong *)((long)puVar30 + (ulong)uVar21);
              }
            }
            else {
              puVar11 = (ulong *)((long)puVar30 + 4);
              puVar24 = (pLVar17->internal_donotuse).hashTable + 1;
              puVar32 = puVar11;
              if (puVar11 < puVar31) {
                uVar18 = *(ulong *)((long)puVar30 + 4) ^
                         *(ulong *)((pLVar17->internal_donotuse).hashTable + 1);
                uVar43 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar43 = uVar43 >> 3 & 0x1fffffff;
                puVar32 = (ulong *)((long)puVar30 + 0xc);
                puVar24 = (pLVar17->internal_donotuse).hashTable + 3;
                if (*(ulong *)((pLVar17->internal_donotuse).hashTable + 1) ==
                    *(ulong *)((long)puVar30 + 4)) goto LAB_0011644a;
              }
              else {
LAB_0011644a:
                do {
                  if (puVar31 <= puVar32) {
                    if ((puVar32 < source + (long)srcSize + -8) && (*puVar24 == (uint32_t)*puVar32))
                    {
                      puVar32 = (ulong *)((long)puVar32 + 4);
                      puVar24 = puVar24 + 1;
                    }
                    if ((puVar32 < source + (long)srcSize + -6) &&
                       ((short)*puVar24 == (short)*puVar32)) {
                      puVar32 = (ulong *)((long)puVar32 + 2);
                      puVar24 = (uint32_t *)((long)puVar24 + 2);
                    }
                    if (puVar32 < puVar10) {
                      puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar24 == (char)*puVar32))
                      ;
                    }
                    uVar43 = (ulong)(uint)((int)puVar32 - (int)puVar11);
                    goto LAB_00116485;
                  }
                  uVar43 = *(ulong *)puVar24;
                  uVar18 = *puVar32;
                  uVar35 = uVar18 ^ uVar43;
                  uVar37 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  iVar27 = (int)puVar32;
                  puVar24 = puVar24 + 2;
                  puVar32 = puVar32 + 1;
                } while (uVar43 == uVar18);
                uVar43 = (ulong)((((uint)(uVar37 >> 3) & 0x1fffffff) + iVar27) - (int)puVar11);
              }
LAB_00116485:
              puVar30 = (ulong *)((long)puVar30 + uVar43 + 4);
            }
            dest = (char *)((long)puVar38 + 2);
            uVar21 = (uint)uVar43;
            if (uVar21 < 0xf) {
              *(char *)puVar14 = (char)*puVar14 + (char)uVar43;
            }
            else {
              *(char *)puVar14 = (char)*puVar14 + '\x0f';
              uVar28 = uVar21 - 0xf;
              *(undefined4 *)dest = 0xffffffff;
              if (0x3fb < uVar28) {
                uVar21 = uVar21 - 0x40b;
                memset((char *)((long)puVar38 + 6),0xff,(ulong)((uVar21 / 0x3fc) * 4 + 4));
                uVar28 = uVar21 % 0x3fc;
                dest = (char *)((long)puVar38 + (ulong)((uVar21 / 0x3fc) * 4) + 6);
              }
              pcVar12 = (char *)((long)dest + (ulong)uVar28 / 0xff);
              dest = pcVar12 + 1;
              *pcVar12 = (char)((ulong)uVar28 * 0x8080808081 >> 0x27);
            }
            puVar11 = puVar30;
            if (source + (long)srcSize + -0xb <= puVar30) {
              iVar27 = 3;
              puVar32 = puVar30;
              goto LAB_00116860;
            }
            *(int *)((long)LZ4_dict +
                    ((ulong)(*(long *)((long)puVar30 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)puVar30 + -2) - iVar15;
            uVar43 = *puVar30 * -0x30e4432345000000 >> 0x34;
            uVar28 = (int)puVar30 - iVar15;
            uVar21 = *(uint *)((long)LZ4_dict + uVar43 * 4);
            pcVar12 = pcVar34;
            if (uVar21 < uVar2) {
              pcVar12 = pcVar16;
            }
            pLVar17 = (LZ4_stream_t *)(pcVar12 + uVar21);
            pLVar25 = (LZ4_stream_t *)source;
            if (uVar21 < uVar2) {
              pLVar25 = pLVar3;
            }
            *(uint *)((long)LZ4_dict + uVar43 * 4) = uVar28;
            bVar45 = true;
            puVar38 = (ulong *)dest;
            if (((uVar2 - uVar23 <= uVar21) && (uVar28 <= uVar21 + 0xffff)) &&
               ((pLVar17->internal_donotuse).hashTable[0] == (uint32_t)*puVar30)) {
              *dest = '\0';
              iVar22 = uVar28 - uVar21;
              bVar45 = false;
              puVar38 = (ulong *)((long)dest + 1);
              puVar14 = (ulong *)dest;
            }
          } while (!bVar45);
          uVar42 = (ulong)(*(long *)((long)puVar30 + 1) * -0x30e4432345000000) >> 0x34;
          iVar27 = 0;
          puVar32 = (ulong *)((long)puVar30 + 1);
          dest = (char *)puVar38;
        }
LAB_00116860:
      } while (iVar27 == 0);
      if (iVar27 - 2U < 2) goto LAB_0011688b;
LAB_00117145:
      iVar40 = 0;
      goto LAB_0011711d;
    }
LAB_0011688b:
    pcVar16 = source + ((long)srcSize - (long)puVar11);
    if ((char *)0xe < pcVar16) {
      pcVar34 = pcVar16 + -0xf;
      *dest = -0x10;
      puVar32 = (ulong *)((long)dest + 1);
      if ((char *)0xfe < pcVar34) {
        uVar26 = (ulong)(pcVar16 + -0x10e) / 0xff;
        memset(puVar32,0xff,uVar26 + 1);
        goto LAB_001170d7;
      }
      goto LAB_001170f3;
    }
LAB_001170fa:
    *dest = (char)pcVar16 << 4;
  }
  else {
LAB_001168ea:
    if (0x7e000000 < (uint)srcSize) {
LAB_001168f2:
      iVar40 = 0;
      goto LAB_0011711d;
    }
    uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
    piVar4 = (int *)(LZ4_dict->internal_donotuse).dictionary;
    (LZ4_dict->internal_donotuse).dictSize = uVar23 + srcSize;
    (LZ4_dict->internal_donotuse).currentOffset = uVar2 + srcSize;
    (LZ4_dict->internal_donotuse).tableType = 2;
    if (0xc < srcSize) {
      lVar20 = (long)source - (ulong)uVar2;
      puVar10 = (ulong *)(source + (long)srcSize + -5);
      lVar13 = (long)piVar4 + (uVar26 - uVar2);
      *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar2;
      puVar31 = (ulong *)(source + 1);
      uVar42 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      puVar32 = (ulong *)(source + (long)srcSize + -0xc);
      iVar22 = 0;
      piVar41 = (int *)source;
      local_d0 = (ulong *)dest;
      do {
        uVar23 = 0x40;
        uVar21 = 1;
        while( true ) {
          puVar30 = (ulong *)((ulong)uVar21 + (long)puVar31);
          iVar15 = (int)lVar20;
          if (source + (long)srcSize + -0xb < puVar30) {
            iVar27 = 2;
          }
          else {
            uVar28 = (int)puVar31 - iVar15;
            uVar21 = *(uint *)((long)LZ4_dict + uVar42 * 4);
            lVar8 = lVar20;
            if (uVar21 < uVar2) {
              lVar8 = lVar13;
            }
            local_c8 = (int *)(lVar8 + (ulong)uVar21);
            piVar41 = (int *)source;
            if (uVar21 < uVar2) {
              piVar41 = piVar4;
            }
            uVar43 = *puVar30 * -0x30e4432345000000 >> 0x34;
            *(uint *)((long)LZ4_dict + uVar42 * 4) = uVar28;
            iVar27 = 8;
            uVar42 = uVar43;
            if (uVar28 <= uVar21 + 0xffff) {
              if (*local_c8 == (int)*puVar31) {
                iVar22 = uVar28 - uVar21;
                iVar27 = 7;
              }
              else {
                iVar27 = 0;
              }
            }
          }
          if ((iVar27 != 0) && (iVar27 != 8)) break;
          uVar21 = uVar23 >> 6;
          uVar23 = uVar23 + 1;
          puVar31 = puVar30;
        }
        if (iVar27 == 7) {
          iVar27 = 0;
        }
        if (iVar27 == 0) {
          iVar27 = (int)puVar31 - (int)puVar11;
          lVar8 = 0;
          uVar23 = iVar27 - 0xfU;
          cVar9 = (char)puVar31 * '\x10' + (char)puVar11 * -0x10;
          do {
            cVar29 = cVar9;
            uVar21 = uVar23;
            lVar39 = lVar8;
            piVar44 = (int *)((long)local_c8 + lVar39);
            puVar30 = (ulong *)((long)puVar31 + lVar39);
            if ((piVar44 <= piVar41) || (puVar30 <= puVar11)) break;
            lVar8 = lVar39 + -1;
            uVar23 = uVar21 - 1;
            cVar9 = cVar29 + -0x10;
          } while (*(char *)((long)puVar31 + lVar39 + -1) == *(char *)((long)local_c8 + lVar39 + -1)
                  );
          iVar5 = (int)lVar39;
          puVar31 = (ulong *)((long)local_d0 + 1);
          if ((uint)(iVar27 + iVar5) < 0xf) {
            *(char *)local_d0 = cVar29;
          }
          else {
            uVar43 = (ulong)(iVar27 - 0xfU) + lVar39;
            *(char *)local_d0 = -0x10;
            if (0xfe < (int)uVar43) {
              if (0x1fc < (int)uVar21) {
                uVar21 = 0x1fd;
              }
              uVar23 = (iVar27 - uVar21) + iVar5 + 0xef;
              uVar43 = (ulong)uVar23 / 0xff;
              memset(puVar31,0xff,(ulong)(uVar23 / 0xff + 1));
              puVar31 = (ulong *)((long)local_d0 + uVar43 + 2);
              uVar43 = (ulong)(uint)(iVar27 + -0x10e + iVar5 + (int)uVar43 * -0xff);
            }
            *(char *)puVar31 = (char)uVar43;
            puVar31 = (ulong *)((long)puVar31 + 1);
          }
          puVar38 = (ulong *)((ulong)(uint)((int)puVar30 - (int)puVar11) + (long)puVar31);
          do {
            *puVar31 = *puVar11;
            puVar31 = puVar31 + 1;
            puVar11 = puVar11 + 1;
          } while (puVar31 < puVar38);
          do {
            *(short *)puVar38 = (short)iVar22;
            if (piVar41 == piVar4) {
              puVar11 = (ulong *)((long)piVar4 + (uVar26 - (long)piVar44) + (long)puVar30);
              if (puVar10 < puVar11) {
                puVar11 = puVar10;
              }
              puVar31 = (ulong *)((long)puVar30 + 4);
              puVar14 = (ulong *)(piVar44 + 1);
              puVar19 = puVar31;
              puVar36 = puVar14;
              if (puVar31 < (ulong *)((long)puVar11 - 7U)) {
                uVar18 = *(ulong *)((long)puVar30 + 4) ^ *(ulong *)(piVar44 + 1);
                uVar43 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar43 = uVar43 >> 3 & 0x1fffffff;
                puVar19 = (ulong *)((long)puVar30 + 0xc);
                puVar36 = (ulong *)(piVar44 + 3);
                if (*(ulong *)(piVar44 + 1) == *(ulong *)((long)puVar30 + 4)) goto LAB_00116cf6;
              }
              else {
LAB_00116cf6:
                do {
                  puVar14 = puVar36;
                  if ((ulong *)((long)puVar11 - 7U) <= puVar19) {
                    if ((puVar19 < (ulong *)((long)puVar11 - 3U)) &&
                       ((int)*puVar14 == (int)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar19 < (ulong *)((long)puVar11 - 1U)) &&
                       ((short)*puVar14 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar19 < puVar11) {
                      uVar43 = *puVar14;
                      puVar14 = (ulong *)CONCAT71((int7)((ulong)puVar14 >> 8),(char)uVar43);
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((char)uVar43 == (char)*puVar19));
                    }
                    uVar43 = (ulong)(uint)((int)puVar19 - (int)puVar31);
                    goto LAB_00116d36;
                  }
                  uVar43 = *puVar14;
                  uVar18 = *puVar19;
                  uVar35 = uVar18 ^ uVar43;
                  uVar37 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  iVar27 = (int)puVar19;
                  puVar14 = puVar14 + 1;
                  puVar19 = puVar19 + 1;
                  puVar36 = puVar14;
                } while (uVar43 == uVar18);
                uVar43 = (ulong)((((uint)(uVar37 >> 3) & 0x1fffffff) + iVar27) - (int)puVar31);
              }
LAB_00116d36:
              uVar23 = (uint)uVar43;
              puVar30 = (ulong *)((long)puVar30 + uVar43 + 4);
              if (puVar30 == puVar11) {
                puVar19 = puVar11;
                puVar31 = (ulong *)source;
                if (puVar11 < puVar32) {
                  uVar43 = *(ulong *)source;
                  uVar18 = *puVar11;
                  uVar37 = 0;
                  if ((uVar18 ^ uVar43) != 0) {
                    for (; ((uVar18 ^ uVar43) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  puVar14 = (ulong *)(uVar37 >> 3 & 0x1fffffff);
                  uVar21 = (uint)puVar14;
                  if (uVar43 == uVar18) {
                    puVar31 = (ulong *)(source + (ulong)(uVar43 == uVar18) * 8);
                    puVar19 = puVar11 + (uVar43 == uVar18);
                    goto LAB_00116d81;
                  }
                }
                else {
LAB_00116d81:
                  do {
                    if (puVar32 <= puVar19) {
                      if ((puVar19 < source + (long)srcSize + -8) &&
                         ((int)*puVar31 == (int)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 4);
                        puVar31 = (ulong *)((long)puVar31 + 4);
                      }
                      if ((puVar19 < source + (long)srcSize + -6) &&
                         ((short)*puVar31 == (short)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 2);
                        puVar31 = (ulong *)((long)puVar31 + 2);
                      }
                      if (puVar19 < puVar10) {
                        puVar19 = (ulong *)((long)puVar19 +
                                           (ulong)((char)*puVar31 == (char)*puVar19));
                      }
                      uVar21 = (int)puVar19 - (int)puVar11;
                      break;
                    }
                    uVar43 = *puVar31;
                    uVar37 = *puVar19 ^ uVar43;
                    uVar18 = 0;
                    if (uVar37 != 0) {
                      for (; (uVar37 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    puVar36 = (ulong *)((uVar18 >> 3 & 0x1fffffff) + (long)puVar19);
                    puVar31 = puVar31 + 1;
                    bVar45 = uVar43 == *puVar19;
                    puVar19 = puVar19 + 1;
                    if (!bVar45) {
                      puVar19 = puVar36;
                    }
                    puVar14 = (ulong *)((ulong)puVar14 & 0xffffffff);
                    if (!bVar45) {
                      puVar14 = (ulong *)(ulong)(uint)((int)puVar36 - (int)puVar11);
                    }
                    uVar21 = (uint)puVar14;
                  } while (bVar45);
                }
                uVar23 = uVar23 + uVar21;
                puVar30 = (ulong *)((long)puVar30 + (ulong)uVar21);
              }
            }
            else {
              puVar11 = (ulong *)((long)puVar30 + 4);
              puVar31 = (ulong *)(piVar44 + 1);
              puVar14 = puVar11;
              if (puVar11 < puVar32) {
                uVar18 = *(ulong *)((long)puVar30 + 4) ^ *(ulong *)(piVar44 + 1);
                uVar43 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar43 = uVar43 >> 3 & 0x1fffffff;
                puVar14 = (ulong *)((long)puVar30 + 0xc);
                puVar31 = (ulong *)(piVar44 + 3);
                if (*(ulong *)(piVar44 + 1) == *(ulong *)((long)puVar30 + 4)) goto LAB_00116c51;
              }
              else {
LAB_00116c51:
                do {
                  if (puVar32 <= puVar14) {
                    if ((puVar14 < source + (long)srcSize + -8) && ((int)*puVar31 == (int)*puVar14))
                    {
                      puVar14 = (ulong *)((long)puVar14 + 4);
                      puVar31 = (ulong *)((long)puVar31 + 4);
                    }
                    if ((puVar14 < source + (long)srcSize + -6) &&
                       ((short)*puVar31 == (short)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 2);
                      puVar31 = (ulong *)((long)puVar31 + 2);
                    }
                    if (puVar14 < puVar10) {
                      puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar31 == (char)*puVar14))
                      ;
                    }
                    uVar43 = (ulong)(uint)((int)puVar14 - (int)puVar11);
                    goto LAB_00116c8c;
                  }
                  uVar43 = *puVar31;
                  uVar18 = *puVar14;
                  uVar35 = uVar18 ^ uVar43;
                  uVar37 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  iVar27 = (int)puVar14;
                  puVar31 = puVar31 + 1;
                  puVar14 = puVar14 + 1;
                } while (uVar43 == uVar18);
                uVar43 = (ulong)((((uint)(uVar37 >> 3) & 0x1fffffff) + iVar27) - (int)puVar11);
              }
LAB_00116c8c:
              uVar23 = (uint)uVar43;
              puVar30 = (ulong *)((long)puVar30 + uVar43 + 4);
            }
            puVar14 = (ulong *)((long)puVar38 + 2);
            if (uVar23 < 0xf) {
              *(char *)local_d0 = (char)*local_d0 + (char)uVar23;
            }
            else {
              *(char *)local_d0 = (char)*local_d0 + '\x0f';
              uVar21 = uVar23 - 0xf;
              *(undefined4 *)puVar14 = 0xffffffff;
              if (0x3fb < uVar21) {
                uVar23 = uVar23 - 0x40b;
                memset((char *)((long)puVar38 + 6),0xff,(ulong)((uVar23 / 0x3fc) * 4 + 4));
                uVar21 = uVar23 % 0x3fc;
                puVar14 = (ulong *)((long)puVar38 + (ulong)((uVar23 / 0x3fc) * 4) + 6);
              }
              pcVar16 = (char *)((long)puVar14 + (ulong)uVar21 / 0xff);
              puVar14 = (ulong *)(pcVar16 + 1);
              *pcVar16 = (char)((ulong)uVar21 * 0x8080808081 >> 0x27);
            }
            puVar11 = puVar30;
            if (source + (long)srcSize + -0xb <= puVar30) {
              iVar27 = 3;
              puVar31 = puVar30;
              local_d0 = puVar14;
              local_c8 = piVar44;
              goto LAB_00117055;
            }
            *(int *)((long)LZ4_dict +
                    ((ulong)(*(long *)((long)puVar30 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)puVar30 + -2) - iVar15;
            uVar43 = *puVar30 * -0x30e4432345000000 >> 0x34;
            uVar21 = (int)puVar30 - iVar15;
            uVar23 = *(uint *)((long)LZ4_dict + uVar43 * 4);
            lVar8 = lVar20;
            if (uVar23 < uVar2) {
              lVar8 = lVar13;
            }
            piVar44 = (int *)((ulong)uVar23 + lVar8);
            piVar41 = (int *)source;
            if (uVar23 < uVar2) {
              piVar41 = piVar4;
            }
            *(uint *)((long)LZ4_dict + uVar43 * 4) = uVar21;
            bVar45 = true;
            puVar38 = puVar14;
            if ((uVar21 <= uVar23 + 0xffff) && (*piVar44 == (int)*puVar30)) {
              *(char *)puVar14 = '\0';
              iVar22 = uVar21 - uVar23;
              bVar45 = false;
              puVar38 = (ulong *)((long)puVar14 + 1);
              local_d0 = puVar14;
            }
          } while (!bVar45);
          uVar42 = (ulong)(*(long *)((long)puVar30 + 1) * -0x30e4432345000000) >> 0x34;
          iVar27 = 0;
          puVar31 = (ulong *)((long)puVar30 + 1);
          local_d0 = puVar38;
          local_c8 = piVar44;
        }
LAB_00117055:
      } while (iVar27 == 0);
      dest = (char *)local_d0;
      if (1 < iVar27 - 2U) goto LAB_00117145;
    }
    pcVar16 = source + ((long)srcSize - (long)puVar11);
    if (pcVar16 < (char *)0xf) goto LAB_001170fa;
    pcVar34 = pcVar16 + -0xf;
    *dest = -0x10;
    puVar32 = (ulong *)((long)dest + 1);
    if ((char *)0xfe < pcVar34) {
      uVar26 = (ulong)(pcVar16 + -0x10e) / 0xff;
      memset(puVar32,0xff,uVar26 + 1);
LAB_001170d7:
      puVar32 = (ulong *)((long)dest + uVar26 + 2);
      pcVar34 = pcVar16 + uVar26 * -0xff + -0x10e;
    }
LAB_001170f3:
    *(char *)puVar32 = (char)pcVar34;
    dest = (char *)puVar32;
  }
  memcpy((char *)((long)dest + 1),puVar11,(size_t)pcVar16);
  iVar40 = ((int)(char *)((long)dest + 1) + (int)pcVar16) - iVar40;
LAB_0011711d:
  (LZ4_dict->internal_donotuse).dictionary = (uint8_t *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return iVar40;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}